

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O1

mcpl_outfile_t mcpl_create_outfile(char *filename)

{
  long lVar1;
  int iVar2;
  size_t __n;
  char *pcVar3;
  mcpl_outfile_t of;
  MCTOOLS_FILE_t *pMVar4;
  mcu8str f;
  mcu8str mStack_38;
  
  if (filename == (char *)0x0) {
    pcVar3 = "mcpl_create_outfile called with null string.";
    goto LAB_00102bfc;
  }
  __n = strlen(filename);
  if (__n == 0) {
    pcVar3 = "mcpl_create_outfile called with empty string.";
    goto LAB_00102bfc;
  }
  if (0x1000 < __n) {
    pcVar3 = "mcpl_create_outfile called with too long string.";
    goto LAB_00102bfc;
  }
  pcVar3 = strrchr(filename,0x2e);
  if (__n == 5 && pcVar3 == filename) {
    pcVar3 = "mcpl_create_outfile called with string with no basename part (\".mcpl\").";
    goto LAB_00102bfc;
  }
  of.internal = mcpl_internal_calloc(1,0xe8);
  if (pcVar3 == (char *)0x0) {
LAB_00102b0c:
    pcVar3 = mcpl_internal_malloc(__n + 6);
    *(char **)of.internal = pcVar3;
    memcpy(pcVar3,filename,__n);
    lVar1 = *of.internal;
    *(undefined4 *)(lVar1 + __n) = 0x70636d2e;
    *(undefined2 *)(lVar1 + 4 + __n) = 0x6c;
  }
  else {
    iVar2 = strcmp(pcVar3,".mcpl");
    if (iVar2 != 0) goto LAB_00102b0c;
    pcVar3 = mcpl_internal_malloc(__n + 1);
    *(char **)of.internal = pcVar3;
    memcpy(pcVar3,filename,__n + 1);
  }
  *(undefined8 *)((long)of.internal + 0x10) = 0;
  *(undefined4 *)((long)of.internal + 0x18) = 0;
  *(undefined8 *)((long)of.internal + 0x20) = 0;
  *(undefined4 *)((long)of.internal + 0x28) = 0;
  *(undefined8 *)((long)of.internal + 0x30) = 0;
  *(undefined8 *)((long)of.internal + 0x38) = 0;
  *(undefined8 *)((long)of.internal + 0x40) = 0;
  *(undefined8 *)((long)of.internal + 0x48) = 0;
  *(undefined8 *)((long)of.internal + 0x50) = 1;
  *(undefined8 *)((long)of.internal + 0x58) = 0;
  *(undefined4 *)((long)of.internal + 0x60) = 1;
  *(undefined8 *)((long)of.internal + 0x68) = 0;
  mcu8str_view_cstr(&mStack_38,*of.internal);
  pMVar4 = mctools_fopen(&mStack_38,"wb");
  *(MCTOOLS_FILE_t **)((long)of.internal + 8) = pMVar4;
  if (pMVar4 != (MCTOOLS_FILE_t *)0x0) {
    mcpl_recalc_psize(of);
    return (mcpl_outfile_t)of.internal;
  }
  mcpl_internal_cleanup_outfile((mcpl_outfileinternal_t *)of.internal);
  pcVar3 = "Unable to open output file!";
LAB_00102bfc:
  (*mcpl_error_handler)(pcVar3);
  printf("MCPL ERROR: %s\n",
         "Handler given to mcpl_set_error_handler returns to calling code which is not allowed!");
  exit(1);
}

Assistant:

mcpl_outfile_t mcpl_create_outfile(const char * filename)
{
  //Sanity check chosen filename and append ".mcpl" if missing to help people
  //who forgot to add the extension (in the hope of higher consistency).
  if (!filename)
    mcpl_error("mcpl_create_outfile called with null string.");
  size_t n = strlen(filename);
  if (!n)
    mcpl_error("mcpl_create_outfile called with empty string.");
  if (n>4096)
    mcpl_error("mcpl_create_outfile called with too long string.");
  const char * lastdot = strrchr(filename, '.');
  if (lastdot==filename && n==5)
    mcpl_error("mcpl_create_outfile called with string with no basename part (\".mcpl\").");

  //Initialise data structures and open file:
  mcpl_platform_compatibility_check();

  mcpl_outfile_t out;
  out.internal = NULL;

  mcpl_outfileinternal_t * f
    = (mcpl_outfileinternal_t*)mcpl_internal_calloc( 1, sizeof(mcpl_outfileinternal_t) );

  if (!lastdot || strcmp(lastdot, ".mcpl") != 0) {
    f->filename = mcpl_internal_malloc(n+6);
    memcpy(f->filename,filename,n);
    memcpy(f->filename+n,".mcpl",6);
  } else {
    f->filename = mcpl_internal_malloc(n+1);
    memcpy(f->filename,filename,n+1);
  }

  f->hdr_srcprogname = NULL;
  f->ncomments = 0;
  f->comments = NULL;
  f->nblobs = 0;
  f->blobkeys = NULL;
  f->bloblengths = NULL;
  f->blobs = NULL;
  f->opt_userflags = 0;
  f->opt_polarisation = 0;
  f->opt_singleprec = 1;
  f->opt_universalpdgcode = 0;
  f->opt_universalweight = 0.0;
  f->header_notwritten = 1;
  f->nparticles = 0;
  f->file = mcpl_internal_fopen(f->filename,"wb");
  if (!f->file) {
    mcpl_internal_cleanup_outfile(f);
    mcpl_error("Unable to open output file!");
  }
  out.internal = f;
  mcpl_recalc_psize(out);
  return out;
}